

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint8_linear_scaled(void *outputp,int width_times_channels,float *encode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uchar *puVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar17;
  undefined1 auVar15 [16];
  float fVar18;
  undefined1 auVar16 [16];
  __m128 e0_2;
  __m128i b_1;
  __m128i a_1;
  __m128 bf_1;
  __m128 af_1;
  __m128i i0;
  __m128 e0_1;
  __m128i b;
  __m128i a;
  __m128 bf;
  __m128 af;
  __m128i i;
  __m128 e1;
  __m128 e0;
  float *end_encode_m8;
  uchar *end_output;
  uchar *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  float local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_58;
  
  puVar12 = (uchar *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 8) {
    output = (uchar *)encode;
    for (end_output = (uchar *)((long)outputp + 4); end_output <= puVar12;
        end_output = end_output + 4) {
      local_3e8 = (float)*(undefined8 *)output;
      fStack_3e4 = (float)((ulong)*(undefined8 *)output >> 0x20);
      fStack_3e0 = (float)*(undefined8 *)(output + 8);
      fStack_3dc = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
      fVar17 = fStack_3e0 * 255.0 + 0.5;
      fVar18 = fStack_3dc * 255.0 + 0.5;
      i0[1] = CONCAT44(fStack_3e4 * 255.0 + 0.5,local_3e8 * 255.0 + 0.5);
      auVar3._8_4_ = fVar17;
      auVar3._12_4_ = fVar18;
      auVar3._0_8_ = i0[1];
      auVar16._8_8_ = 0x437f0000437f0000;
      auVar16._0_8_ = 0x437f0000437f0000;
      auVar16 = minps(auVar3,auVar16);
      auVar15._8_4_ = fVar17;
      auVar15._12_4_ = fVar18;
      auVar15._0_8_ = i0[1];
      auVar14._8_8_ = 0x437f0000437f0000;
      auVar14._0_8_ = 0x437f0000437f0000;
      auVar14 = minps(auVar15,auVar14);
      auVar15 = maxps(auVar16,ZEXT816(0));
      auVar14 = maxps(auVar14,ZEXT816(0));
      local_f8 = auVar15._0_4_;
      fStack_f4 = auVar15._4_4_;
      fStack_f0 = auVar15._8_4_;
      fStack_ec = auVar15._12_4_;
      b_1[1] = CONCAT44((int)fStack_f4,(int)local_f8);
      a_1[0]._0_4_ = (int)fStack_f0;
      a_1[0]._4_4_ = (int)fStack_ec;
      local_108 = auVar14._0_4_;
      fStack_104 = auVar14._4_4_;
      fStack_100 = auVar14._8_4_;
      fStack_fc = auVar14._12_4_;
      auVar8._4_4_ = (int)fStack_104;
      auVar8._0_4_ = (int)local_108;
      auVar8._12_4_ = (int)fStack_fc;
      auVar8._8_4_ = (int)fStack_100;
      auVar9._8_8_ = a_1[0];
      auVar9._0_8_ = b_1[1];
      auVar14 = packssdw(auVar9,auVar8);
      local_1f8 = auVar14._0_2_;
      sStack_1f6 = auVar14._2_2_;
      sStack_1f4 = auVar14._4_2_;
      sStack_1f2 = auVar14._6_2_;
      *(uint *)(end_output + -4) =
           CONCAT13((0 < sStack_1f2) * (sStack_1f2 < 0x100) * auVar14[6] - (0xff < sStack_1f2),
                    CONCAT12((0 < sStack_1f4) * (sStack_1f4 < 0x100) * auVar14[4] -
                             (0xff < sStack_1f4),
                             CONCAT11((0 < sStack_1f6) * (sStack_1f6 < 0x100) * auVar14[2] -
                                      (0xff < sStack_1f6),
                                      (0 < local_1f8) * (local_1f8 < 0x100) * auVar14[0] -
                                      (0xff < local_1f8))));
      output = output + 0x10;
    }
    for (end_output = end_output + -4; end_output < puVar12; end_output = end_output + 1) {
      local_58 = CONCAT44(0x3f000000,*(float *)output * 255.0 + 0.5);
      auVar2._8_8_ = 0x3f0000003f000000;
      auVar2._0_8_ = local_58;
      auVar1._8_8_ = 0x437f0000437f0000;
      auVar1._0_8_ = 0x437f0000437f0000;
      auVar14 = minps(auVar2,auVar1);
      auVar14 = maxps(auVar14,ZEXT816(0));
      local_118 = auVar14._0_4_;
      *end_output = (uchar)(int)local_118;
      output = output + 4;
    }
  }
  else {
    end_output = (uchar *)outputp;
    output = (uchar *)encode;
    do {
      do {
        local_3a8 = (float)*(undefined8 *)output;
        fStack_3a4 = (float)((ulong)*(undefined8 *)output >> 0x20);
        fStack_3a0 = (float)*(undefined8 *)(output + 8);
        fStack_39c = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        local_3c8 = (float)*(undefined8 *)(output + 0x10);
        fStack_3c4 = (float)((ulong)*(undefined8 *)(output + 0x10) >> 0x20);
        fStack_3c0 = (float)*(undefined8 *)(output + 0x18);
        fStack_3bc = (float)((ulong)*(undefined8 *)(output + 0x18) >> 0x20);
        auVar7._4_4_ = fStack_3a4 * 255.0 + 0.5;
        auVar7._0_4_ = local_3a8 * 255.0 + 0.5;
        auVar7._12_4_ = fStack_39c * 255.0 + 0.5;
        auVar7._8_4_ = fStack_3a0 * 255.0 + 0.5;
        auVar6._8_8_ = 0x437f0000437f0000;
        auVar6._0_8_ = 0x437f0000437f0000;
        auVar15 = minps(auVar7,auVar6);
        auVar5._4_4_ = fStack_3c4 * 255.0 + 0.5;
        auVar5._0_4_ = local_3c8 * 255.0 + 0.5;
        auVar5._12_4_ = fStack_3bc * 255.0 + 0.5;
        auVar5._8_4_ = fStack_3c0 * 255.0 + 0.5;
        auVar4._8_8_ = 0x437f0000437f0000;
        auVar4._0_8_ = 0x437f0000437f0000;
        auVar14 = minps(auVar5,auVar4);
        auVar15 = maxps(auVar15,ZEXT816(0));
        auVar14 = maxps(auVar14,ZEXT816(0));
        local_d8 = auVar15._0_4_;
        fStack_d4 = auVar15._4_4_;
        fStack_d0 = auVar15._8_4_;
        fStack_cc = auVar15._12_4_;
        b[1] = CONCAT44((int)fStack_d4,(int)local_d8);
        a[0]._0_4_ = (int)fStack_d0;
        a[0]._4_4_ = (int)fStack_cc;
        local_e8 = auVar14._0_4_;
        fStack_e4 = auVar14._4_4_;
        fStack_e0 = auVar14._8_4_;
        fStack_dc = auVar14._12_4_;
        auVar10._4_4_ = (int)fStack_e4;
        auVar10._0_4_ = (int)local_e8;
        auVar10._12_4_ = (int)fStack_dc;
        auVar10._8_4_ = (int)fStack_e0;
        auVar11._8_8_ = a[0];
        auVar11._0_8_ = b[1];
        auVar14 = packssdw(auVar11,auVar10);
        local_1d8 = auVar14._0_2_;
        sStack_1d6 = auVar14._2_2_;
        sStack_1d4 = auVar14._4_2_;
        sStack_1d2 = auVar14._6_2_;
        sStack_1d0 = auVar14._8_2_;
        sStack_1ce = auVar14._10_2_;
        sStack_1cc = auVar14._12_2_;
        sStack_1ca = auVar14._14_2_;
        *(ulong *)end_output =
             CONCAT17((0 < sStack_1ca) * (sStack_1ca < 0x100) * auVar14[0xe] - (0xff < sStack_1ca),
                      CONCAT16((0 < sStack_1cc) * (sStack_1cc < 0x100) * auVar14[0xc] -
                               (0xff < sStack_1cc),
                               CONCAT15((0 < sStack_1ce) * (sStack_1ce < 0x100) * auVar14[10] -
                                        (0xff < sStack_1ce),
                                        CONCAT14((0 < sStack_1d0) * (sStack_1d0 < 0x100) *
                                                 auVar14[8] - (0xff < sStack_1d0),
                                                 CONCAT13((0 < sStack_1d2) * (sStack_1d2 < 0x100) *
                                                          auVar14[6] - (0xff < sStack_1d2),
                                                          CONCAT12((0 < sStack_1d4) *
                                                                   (sStack_1d4 < 0x100) * auVar14[4]
                                                                   - (0xff < sStack_1d4),
                                                                   CONCAT11((0 < sStack_1d6) *
                                                                            (sStack_1d6 < 0x100) *
                                                                            auVar14[2] -
                                                                            (0xff < sStack_1d6),
                                                                            (0 < local_1d8) *
                                                                            (local_1d8 < 0x100) *
                                                                            auVar14[0] -
                                                                            (0xff < local_1d8)))))))
                     );
        output = output + 0x20;
        end_output = end_output + 8;
      } while (end_output <= puVar12 + -8);
      bVar13 = end_output != puVar12;
      end_output = puVar12 + -8;
      output = (uchar *)(encode + (long)width_times_channels + -8);
    } while (bVar13);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear_scaled )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode );
      stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_madd( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_uint8( e0 );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}